

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hh
# Opt level: O2

void __thiscall avro::Exception::Exception(Exception *this,format *msg)

{
  string_type sStack_38;
  
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (&sStack_38,msg);
  std::runtime_error::runtime_error((runtime_error *)&this->field_0x8,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  this->_vptr_Exception = (_func_int **)0x1f1458;
  *(undefined8 *)&this->field_0x8 = 0x1f1488;
  return;
}

Assistant:

Exception(const boost::format &msg) :
        std::runtime_error( boost::str(msg))
    { }